

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.h
# Opt level: O0

void clause_unwatch(solver_t *s,uint cref)

{
  vec_wl_t *pvVar1;
  uint uVar2;
  clause_conflict *pcVar3;
  watch_list *pwVar4;
  clause_conflict *clause;
  uint cref_local;
  solver_t *s_local;
  
  pcVar3 = cdb_handler(s->all_clauses,cref);
  pvVar1 = s->watches;
  uVar2 = lit_compl(*(uint *)(pcVar3 + 1));
  pwVar4 = vec_wl_at(pvVar1,uVar2);
  watch_list_remove(pwVar4,cref,(uint)(pcVar3->size == 2));
  pvVar1 = s->watches;
  uVar2 = lit_compl(pcVar3[1].size);
  pwVar4 = vec_wl_at(pvVar1,uVar2);
  watch_list_remove(pwVar4,cref,(uint)(pcVar3->size == 2));
  return;
}

Assistant:

static inline void clause_unwatch(solver_t *s, unsigned cref)
{
    struct clause *clause = cdb_handler(s->all_clauses, cref);
    watch_list_remove(vec_wl_at(s->watches, lit_compl(clause->data[0].lit)), cref, (clause->size == 2));
    watch_list_remove(vec_wl_at(s->watches, lit_compl(clause->data[1].lit)), cref, (clause->size == 2));
}